

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_astar.hpp
# Opt level: O1

vector<Tiles::State,_std::allocator<Tiles::State>_> * __thiscall
external_astar::ExternalAstar<Tiles>::search
          (vector<Tiles::State,_std::allocator<Tiles::State>_> *__return_storage_ptr__,
          ExternalAstar<Tiles> *this,State *init)

{
  ExternalAstarOpenList<Node<Tiles>_> *this_00;
  size_t *psVar1;
  pointer *ppSVar2;
  char cVar3;
  int iVar4;
  iterator iVar5;
  char cVar6;
  char cVar7;
  undefined8 uVar8;
  vector<Tiles::State,std::allocator<Tiles::State>> *this_01;
  vector<Tiles::State,_std::allocator<Tiles::State>_> *pvVar9;
  int i;
  long lVar10;
  Tiles *pTVar11;
  long lVar12;
  char cVar13;
  State state;
  Node<Tiles> n;
  Node<Tiles> parent;
  State parent_state;
  State local_9a;
  Node<Tiles> local_88;
  Node<Tiles> local_70;
  vector<Tiles::State,std::allocator<Tiles::State>> *local_58;
  vector<Tiles::State,_std::allocator<Tiles::State>_> *local_50;
  State local_42;
  
  uVar8 = local_88._0_8_;
  lVar10 = 0;
  local_88.g = '\0';
  local_88.f = init->h;
  local_88._3_5_ = SUB85(uVar8,3);
  local_88.pop = -1;
  init->tiles[init->blank] = '\0';
  local_88.parent_packed.word = 0;
  do {
    local_88.parent_packed.word = (long)init->tiles[lVar10] | local_88.parent_packed.word << 4;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x10);
  this_00 = &this->open;
  local_88.packed.word = local_88.parent_packed.word;
  local_50 = __return_storage_ptr__;
  ExternalAstarOpenList<Node<Tiles>_>::push(this_00,&local_88);
  local_58 = (vector<Tiles::State,std::allocator<Tiles::State>> *)&this->path;
  do {
    this_01 = local_58;
    if ((this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
        super__Vector_impl_data._M_start) break;
    ExternalAstarOpenList<Node<Tiles>_>::pop(&local_88,this_00);
    Tiles::unpack((this->super_SearchAlg<Tiles>).dom,&local_9a,local_88.packed);
    cVar6 = local_9a.h;
    if (local_9a.h == '\0') {
      iVar5._M_current =
           (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Tiles::State,std::allocator<Tiles::State>>::
        _M_realloc_insert<Tiles::State_const&>(this_01,iVar5,&local_9a);
      }
      else {
        (iVar5._M_current)->blank = local_9a.blank;
        (iVar5._M_current)->h = local_9a.h;
        *(undefined8 *)(iVar5._M_current)->tiles = local_9a.tiles._0_8_;
        *(undefined8 *)((iVar5._M_current)->tiles + 8) = local_9a.tiles._8_8_;
        ppSVar2 = &(this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar2 = *ppSVar2 + 1;
      }
      while (local_88.packed.word != local_88.parent_packed.word) {
        ExternalAstarOpenList<Node<Tiles>_>::trace_parent(&local_70,this_00,&local_88);
        Tiles::unpack((this->super_SearchAlg<Tiles>).dom,&local_42,local_70.packed);
        iVar5._M_current =
             (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Tiles::State,std::allocator<Tiles::State>>::
          _M_realloc_insert<Tiles::State_const&>(this_01,iVar5,&local_42);
        }
        else {
          (iVar5._M_current)->blank = local_42.blank;
          (iVar5._M_current)->h = local_42.h;
          *(undefined8 *)(iVar5._M_current)->tiles = local_42.tiles._0_8_;
          *(undefined8 *)((iVar5._M_current)->tiles + 8) = local_42.tiles._8_8_;
          ppSVar2 = &(this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppSVar2 = *ppSVar2 + 1;
        }
        local_88.g = local_70.g;
        local_88.f = local_70.f;
        local_88.pop = local_70.pop;
        local_88._3_5_ = local_70._3_5_;
        local_88.parent_packed.word = local_70.parent_packed.word;
        local_88.packed.word = local_70.packed.word;
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>,_std::_Select1st<std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>_>_>
      ::clear((_Rb_tree<int,_std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>,_std::_Select1st<std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>_>_>
               *)this_00);
      rmdir("open_list_buckets");
    }
    else {
      psVar1 = &(this->super_SearchAlg<Tiles>).expd;
      *psVar1 = *psVar1 + 1;
      pTVar11 = (this->super_SearchAlg<Tiles>).dom;
      lVar10 = (long)local_9a.blank;
      if (0 < *(int *)(pTVar11 + lVar10 * 0x14 + 0x4440)) {
        lVar12 = 0;
        cVar13 = local_9a.blank;
        do {
          iVar4 = *(int *)(pTVar11 + lVar12 * 4 + lVar10 * 0x14 + 0x4444);
          if (iVar4 != local_88.pop) {
            psVar1 = &(this->super_SearchAlg<Tiles>).gend;
            *psVar1 = *psVar1 + 1;
            cVar7 = local_9a.h;
            cVar3 = local_9a.tiles[iVar4];
            local_9a.tiles[lVar10] = cVar3;
            local_9a.h = local_9a.h +
                         (char)pTVar11[(long)local_9a.blank * 4 +
                                       (long)cVar3 * 0x400 + (long)iVar4 * 0x40 + 0x440];
            local_9a.blank = (char)iVar4;
            local_70.g = local_88.g + '\x01';
            local_70.f = local_88.g + '\x01' + local_9a.h;
            local_70.pop = cVar13;
            local_70.packed.word = 0;
            local_9a.tiles[(char)iVar4] = '\0';
            lVar10 = 0;
            local_70.packed.word = 0;
            do {
              local_70.packed.word = (long)local_9a.tiles[lVar10] | local_70.packed.word << 4;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 0x10);
            local_70.parent_packed.word = local_88.packed.word;
            ExternalAstarOpenList<Node<Tiles>_>::push(this_00,&local_70);
            local_9a.h = cVar7;
            local_9a.tiles[local_9a.blank] = local_9a.tiles[cVar13];
            local_9a.blank = cVar13;
          }
          lVar12 = lVar12 + 1;
          pTVar11 = (this->super_SearchAlg<Tiles>).dom;
          lVar10 = (long)local_9a.blank;
          cVar13 = local_9a.blank;
        } while (lVar12 < *(int *)(pTVar11 + lVar10 * 0x14 + 0x4440));
      }
    }
  } while (cVar6 != '\0');
  pvVar9 = local_50;
  std::vector<Tiles::State,_std::allocator<Tiles::State>_>::vector
            (local_50,(vector<Tiles::State,_std::allocator<Tiles::State>_> *)local_58);
  return pvVar9;
}

Assistant:

std::vector<typename D::State> search(typename D::State &init) {
            open.push(wrap(init, nullptr, 0, -1));

            while (path.size() == 0) {
                try {
                    Node<D> n = open.pop();

                    typename D::State state;
                    this->dom.unpack(state, n.packed);

                    if (this->dom.isgoal(state)) {
                        // trace path here
                        path.push_back(state);
                        while(n.packed != n.parent_packed) {
                            Node<D> parent = open.trace_parent(n);
                            typename D::State parent_state;
                            this->dom.unpack(parent_state, parent.packed);
                            path.push_back(parent_state);
                            n = parent;
                        }
                        open.clear();
                        break;
                    }
                    this->expd++;
                    for (int i = 0; i < this->dom.nops(state); i++) {
                        int op = this->dom.nthop(state, i);
                        if (op == n.pop)
                            continue;
                        this->gend++;
                        Edge<D> e = this->dom.apply(state, op);
                        open.push(wrap(state, &n, e.cost, e.pop));
                        this->dom.undo(state, e);
                    }
                } catch (OpenListEmpty& e) {
                    break;
                } catch (...) {
                    throw;
                }
            }
            return path;
        }